

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_json.cpp
# Opt level: O0

char * vendorNameFromRuntimeName_abi_cxx11_(char *runtimeName)

{
  char *pcVar1;
  char *pcVar2;
  char *in_RSI;
  allocator local_99;
  string local_98 [32];
  string local_78 [55];
  allocator local_41;
  char *local_40;
  pair<const_char_*,_const_char_*> it;
  pair<const_char_*,_const_char_*> *__end1;
  pair<const_char_*,_const_char_*> *__begin1;
  pair<const_char_*,_const_char_*> (*__range1) [8];
  char *runtimeName_local;
  
  __end1 = vendorNameFromRuntimeName::vendorLookup;
  it.second = (char *)&PTR_anon_var_dwarf_6b76_001117b0;
  while( true ) {
    if (__end1 == (pair<const_char_*,_const_char_*> *)it.second) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_98,in_RSI,&local_99);
      std::operator+((char *)local_78,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     "Unknown vendor (");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     runtimeName,(char *)local_78);
      std::__cxx11::string::~string(local_78);
      std::__cxx11::string::~string(local_98);
      std::allocator<char>::~allocator((allocator<char> *)&local_99);
      return runtimeName;
    }
    local_40 = __end1->first;
    it.first = __end1->second;
    pcVar2 = strstr(in_RSI,local_40);
    pcVar1 = it.first;
    if (pcVar2 != (char *)0x0) break;
    __end1 = __end1 + 1;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)runtimeName,pcVar1,&local_41);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  return runtimeName;
}

Assistant:

static std::string vendorNameFromRuntimeName(const char* runtimeName) {
    static constexpr std::pair<const char*, const char*> vendorLookup[] = {
        {"Qualcomm", "QUALCOMM"},
        {"PICO", "BYTEDANCE"},
        {"HTC", "HTC America, Inc."},
        {"Windows Mixed Reality", "Microsoft Corporation"},
        {"Oculus", "Meta Platforms"},
        {"SteamVR", "Valve Corporation"},
        {"Varjo", "Varjo Technologies Oy"},
        // Monado needs to appear last in this last as other vendors may be using
        // Monado runtime for their headsets.
        {"Monado", "Monado Community + Collabora, Ltd."},
    };

    for (auto it : vendorLookup) {
        if (strstr(runtimeName, it.first) != nullptr) {
            return it.second;
        }
    }

    return "Unknown vendor (" + std::string(runtimeName) + ")";
}